

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

size_t get_quoted_len(char *str,wchar_t qu)

{
  wchar_t wVar1;
  utf8_ptr *this;
  wchar_t in_ESI;
  char *in_RDI;
  wchar_t ch;
  size_t len;
  utf8_ptr p;
  utf8_ptr local_18;
  wchar_t local_c;
  char *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  utf8_ptr::utf8_ptr(&local_18);
  utf8_ptr::set(&local_18,local_8);
  this = (utf8_ptr *)strlen(local_8);
  while( true ) {
    wVar1 = utf8_ptr::getch((utf8_ptr *)0x2efeef);
    if (wVar1 == L'\0') break;
    wVar1 = utf8_ptr::getch((utf8_ptr *)0x2efefe);
    if ((wVar1 == local_c) || (wVar1 == L'\\')) {
      this = (utf8_ptr *)((long)&this->p_ + 1);
    }
    utf8_ptr::inc(this);
  }
  return (size_t)this;
}

Assistant:

static size_t get_quoted_len(const char *str, wchar_t qu)
{
    utf8_ptr p;
    size_t len;

    /* 
     *   scan the string for instances of the quote mark; each one adds an
     *   extra byte to the length needed, since each one requires a
     *   backslash character to escape the quote mark 
     */
    for (p.set((char *)str), len = strlen(str) ; p.getch() != '\0' ; p.inc())
    {
        wchar_t ch;
        
        /* 
         *   check to see if this character is quotable - it is quotable if
         *   it's a backslash or it's the quote character we're escaping 
         */
        ch = p.getch();
        if (ch == qu || ch == '\\')
        {
            /* 
             *   we need to escape this character, so add a byte for the
             *   backslash we'll need to insert 
             */
            ++len;
        }
    }

    /* return the length we calculated */
    return len;
}